

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

Abc_Ntk_t * Io_ReadPla(char *pFileName,int fZeros,int fBoth,int fCheck)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  FILE *pFile;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Extra_FileReader_t *p;
  char *pcVar10;
  Abc_Ntk_t *pNtk;
  ProgressBar *p_00;
  void *pvVar11;
  undefined8 *puVar12;
  void *pvVar13;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *pVVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  int i;
  uint uVar18;
  Abc_Obj_t *pAVar19;
  long lVar20;
  ulong uVar21;
  Mem_Flex_t *pMan;
  long lVar22;
  uint *puVar23;
  void *local_108;
  ulong local_b8;
  char local_98 [104];
  
  p = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t|");
  if (p == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  local_b8 = 0;
  pcVar10 = Extra_FileReaderGetFileName(p);
  pNtk = Abc_NtkStartRead(pcVar10);
  pFile = _stdout;
  iVar4 = Extra_FileReaderGetFileSize(p);
  p_00 = Extra_ProgressBarStart(pFile,iVar4);
  pvVar11 = Extra_FileReaderGetTokens(p);
  if (pvVar11 == (void *)0x0) {
    uVar9 = 0xffffffff;
    local_108 = (void *)0x0;
  }
  else {
    uVar9 = 0xffffffff;
    local_b8 = 0;
    uVar7 = 0xffffffff;
    uVar6 = 0xffffffff;
    local_108 = (void *)0x0;
    do {
      while( true ) {
        iVar4 = Extra_FileReaderGetCurPosition(p);
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar4)) {
          Extra_ProgressBarUpdate_int(p_00,iVar4,(char *)0x0);
        }
        iVar4 = Extra_FileReaderGetLineNumber(p,0);
        puVar12 = *(undefined8 **)((long)pvVar11 + 8);
        pcVar10 = (char *)*puVar12;
        cVar1 = *pcVar10;
        if ((cVar1 == '.') && (pcVar10[1] == 'e')) goto LAB_002d5612;
        iVar5 = strncmp(pcVar10,".type",5);
        if (iVar5 != 0) break;
LAB_002d4ce0:
        pvVar11 = Extra_FileReaderGetTokens(p);
        if (pvVar11 == (void *)0x0) goto LAB_002d5612;
      }
      iVar5 = strcmp(pcVar10,".model");
      if (iVar5 == 0) {
        if (pNtk->pName != (char *)0x0) {
          free(pNtk->pName);
          pNtk->pName = (char *)0x0;
          puVar12 = *(undefined8 **)((long)pvVar11 + 8);
        }
        pcVar10 = Extra_UtilStrsav((char *)puVar12[1]);
        pNtk->pName = pcVar10;
        goto LAB_002d4ce0;
      }
      iVar5 = *(int *)((long)pvVar11 + 4);
      if (iVar5 == 1) {
        pcVar10 = Extra_FileReaderGetFileName(p);
        printf("%s (line %d): Wrong number of token.\n",pcVar10,iVar4);
LAB_002d58d0:
        Abc_NtkDelete(pNtk);
        Extra_ProgressBarStop(p_00);
        if (local_108 != (void *)0x0) {
          free(local_108);
        }
LAB_002d58ed:
        Extra_FileReaderFree(p);
        return (Abc_Ntk_t *)0x0;
      }
      if (cVar1 == '.') {
        cVar1 = pcVar10[1];
        if (cVar1 == 'p') {
          if (pcVar10[2] == '\0') {
            uVar9 = atoi((char *)puVar12[1]);
            goto LAB_002d55db;
          }
          goto LAB_002d4d80;
        }
        if (cVar1 == 'o') {
          if (pcVar10[2] != '\0') goto LAB_002d4d80;
          uVar7 = atoi((char *)puVar12[1]);
        }
        else {
          if ((cVar1 != 'i') || (pcVar10[2] != '\0')) goto LAB_002d4d80;
          uVar6 = atoi((char *)puVar12[1]);
        }
      }
      else {
LAB_002d4d80:
        iVar8 = strcmp(pcVar10,".ilb");
        if (iVar8 == 0) {
          if (iVar5 - 1U != uVar6) {
            printf(
                  "Warning: Mismatch between the number of PIs on the .i line (%d) and the number of PIs on the .ilb line (%d).\n"
                  );
            iVar5 = *(int *)((long)pvVar11 + 4);
          }
          if (1 < iVar5) {
            lVar22 = 1;
            do {
              Io_ReadCreatePi(pNtk,*(char **)(*(long *)((long)pvVar11 + 8) + lVar22 * 8));
              lVar22 = lVar22 + 1;
            } while (lVar22 < *(int *)((long)pvVar11 + 4));
          }
        }
        else {
          iVar8 = strcmp(pcVar10,".ob");
          if (iVar8 != 0) {
            if (pNtk->vPis->nSize == 0) {
              if (uVar6 != 0xffffffff) {
                uVar16 = (ulong)uVar6;
                if (1 < uVar6) {
                  uVar16 = 0;
                  uVar18 = uVar6 - 1;
                  do {
                    uVar16 = (ulong)((int)uVar16 + 1);
                    bVar2 = 9 < uVar18;
                    uVar18 = uVar18 / 10;
                  } while (bVar2);
                }
                if (0 < (int)uVar6) {
                  uVar21 = 0;
                  do {
                    sprintf(local_98,"x%0*d",uVar16,uVar21);
                    Io_ReadCreatePi(pNtk,local_98);
                    uVar18 = (int)uVar21 + 1;
                    uVar21 = (ulong)uVar18;
                  } while (uVar6 != uVar18);
                }
                goto LAB_002d4e32;
              }
              pcVar10 = Extra_FileReaderGetFileName(p);
              pcVar17 = "%s: The number of inputs is not specified.\n";
LAB_002d58c3:
              printf(pcVar17,pcVar10);
            }
            else {
LAB_002d4e32:
              if (pNtk->vPos->nSize == 0) {
                if (uVar7 == 0xffffffff) {
                  pcVar10 = Extra_FileReaderGetFileName(p);
                  pcVar17 = "%s: The number of outputs is not specified.\n";
                  goto LAB_002d58c3;
                }
                uVar16 = (ulong)uVar7;
                if (1 < uVar7) {
                  uVar16 = 0;
                  uVar18 = uVar7 - 1;
                  do {
                    uVar16 = (ulong)((int)uVar16 + 1);
                    bVar2 = 9 < uVar18;
                    uVar18 = uVar18 / 10;
                  } while (bVar2);
                }
                if (0 < (int)uVar7) {
                  uVar21 = 0;
                  do {
                    sprintf(local_98,"z%0*d",uVar16,uVar21);
                    Io_ReadCreatePo(pNtk,local_98);
                    uVar18 = (int)uVar21 + 1;
                    uVar21 = (ulong)uVar18;
                  } while (uVar7 != uVar18);
                }
              }
              if (pNtk->nObjCounts[7] == 0) {
                local_108 = malloc((long)(int)uVar7 << 3);
                pVVar14 = pNtk->vPos;
                if (0 < pVVar14->nSize) {
                  lVar22 = 0;
                  do {
                    pAVar19 = (Abc_Obj_t *)pVVar14->pArray[lVar22];
                    puVar12 = (undefined8 *)malloc(0x10);
                    *puVar12 = 100;
                    pvVar13 = malloc(100);
                    puVar12[1] = pvVar13;
                    *(undefined8 **)((long)local_108 + lVar22 * 8) = puVar12;
                    pFanin = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
                    if (pAVar19->pNtk->ntkType == ABC_NTK_NETLIST) {
                      pAVar19 = (Abc_Obj_t *)
                                pAVar19->pNtk->vObjs->pArray[*(pAVar19->vFanins).pArray];
                    }
                    Abc_ObjAddFanin(pAVar19,pFanin);
                    pVVar14 = pNtk->vPis;
                    if (0 < pVVar14->nSize) {
                      lVar20 = 0;
                      do {
                        pAVar19 = (Abc_Obj_t *)pVVar14->pArray[lVar20];
                        if (pAVar19->pNtk->ntkType == ABC_NTK_NETLIST) {
                          pAVar19 = (Abc_Obj_t *)
                                    pAVar19->pNtk->vObjs->pArray[*(pAVar19->vFanouts).pArray];
                        }
                        Abc_ObjAddFanin(pFanin,pAVar19);
                        lVar20 = lVar20 + 1;
                        pVVar14 = pNtk->vPis;
                      } while (lVar20 < pVVar14->nSize);
                    }
                    lVar22 = lVar22 + 1;
                    pVVar14 = pNtk->vPos;
                  } while (lVar22 < pVVar14->nSize);
                }
              }
              if (*(int *)((long)pvVar11 + 4) == 2) {
                pcVar10 = (char *)**(undefined8 **)((long)pvVar11 + 8);
                pcVar17 = (char *)(*(undefined8 **)((long)pvVar11 + 8))[1];
                sVar15 = strlen(pcVar10);
                if (uVar6 != (uint)sVar15) {
                  pcVar17 = Extra_FileReaderGetFileName(p);
                  sVar15 = strlen(pcVar10);
                  printf("%s (line %d): Input cube length (%d) differs from the number of inputs (%d).\n"
                         ,pcVar17,iVar4,sVar15 & 0xffffffff,(ulong)uVar6);
                  Abc_NtkDelete(pNtk);
                  goto LAB_002d58ed;
                }
                sVar15 = strlen(pcVar17);
                if (uVar7 == (uint)sVar15) {
                  if (fBoth == 0) {
                    if (fZeros == 0) {
                      if (0 < (int)uVar7) {
                        uVar16 = 0;
                        do {
                          if (pcVar17[uVar16] == '1') {
                            puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                            sVar15 = strlen(pcVar10);
                            if (0 < (int)(uint)sVar15) {
                              uVar21 = 0;
                              do {
                                cVar1 = pcVar10[uVar21];
                                uVar18 = puVar23[1];
                                if (uVar18 == *puVar23) {
                                  if ((int)uVar18 < 0x10) {
                                    if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                      pvVar11 = malloc(0x10);
                                    }
                                    else {
                                      pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                                    }
                                    *(void **)(puVar23 + 2) = pvVar11;
                                    *puVar23 = 0x10;
                                  }
                                  else {
                                    sVar3 = (ulong)uVar18 * 2;
                                    if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                      pvVar11 = malloc(sVar3);
                                    }
                                    else {
                                      pvVar11 = realloc(*(void **)(puVar23 + 2),sVar3);
                                    }
                                    *(void **)(puVar23 + 2) = pvVar11;
                                    *puVar23 = (uint)sVar3;
                                  }
                                }
                                else {
                                  pvVar11 = *(void **)(puVar23 + 2);
                                }
                                uVar18 = puVar23[1];
                                puVar23[1] = uVar18 + 1;
                                *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                                uVar21 = uVar21 + 1;
                              } while (((uint)sVar15 & 0x7fffffff) != uVar21);
                              puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                            }
                            lVar22 = 0;
                            do {
                              cVar1 = ".names n%0*d\n 1\n"[lVar22 + 0xd];
                              uVar18 = puVar23[1];
                              if (uVar18 == *puVar23) {
                                if ((int)uVar18 < 0x10) {
                                  if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                    pvVar11 = malloc(0x10);
                                  }
                                  else {
                                    pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                                  }
                                  *(void **)(puVar23 + 2) = pvVar11;
                                  *puVar23 = 0x10;
                                }
                                else {
                                  sVar15 = (ulong)uVar18 * 2;
                                  if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                    pvVar11 = malloc(sVar15);
                                  }
                                  else {
                                    pvVar11 = realloc(*(void **)(puVar23 + 2),sVar15);
                                  }
                                  *(void **)(puVar23 + 2) = pvVar11;
                                  *puVar23 = (uint)sVar15;
                                }
                              }
                              else {
                                pvVar11 = *(void **)(puVar23 + 2);
                              }
                              uVar18 = puVar23[1];
                              puVar23[1] = uVar18 + 1;
                              *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                              lVar22 = lVar22 + 1;
                            } while (lVar22 != 3);
                          }
                          uVar16 = uVar16 + 1;
                        } while (uVar16 != uVar7);
                      }
                    }
                    else if (0 < (int)uVar7) {
                      uVar16 = 0;
                      do {
                        if (pcVar17[uVar16] == '0') {
                          puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                          sVar15 = strlen(pcVar10);
                          if (0 < (int)(uint)sVar15) {
                            uVar21 = 0;
                            do {
                              cVar1 = pcVar10[uVar21];
                              uVar18 = puVar23[1];
                              if (uVar18 == *puVar23) {
                                if ((int)uVar18 < 0x10) {
                                  if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                    pvVar11 = malloc(0x10);
                                  }
                                  else {
                                    pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                                  }
                                  *(void **)(puVar23 + 2) = pvVar11;
                                  *puVar23 = 0x10;
                                }
                                else {
                                  sVar3 = (ulong)uVar18 * 2;
                                  if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                    pvVar11 = malloc(sVar3);
                                  }
                                  else {
                                    pvVar11 = realloc(*(void **)(puVar23 + 2),sVar3);
                                  }
                                  *(void **)(puVar23 + 2) = pvVar11;
                                  *puVar23 = (uint)sVar3;
                                }
                              }
                              else {
                                pvVar11 = *(void **)(puVar23 + 2);
                              }
                              uVar18 = puVar23[1];
                              puVar23[1] = uVar18 + 1;
                              *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                              uVar21 = uVar21 + 1;
                            } while (((uint)sVar15 & 0x7fffffff) != uVar21);
                            puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                          }
                          lVar22 = 0;
                          do {
                            cVar1 = ".names n%0*d\n 1\n"[lVar22 + 0xd];
                            uVar18 = puVar23[1];
                            if (uVar18 == *puVar23) {
                              if ((int)uVar18 < 0x10) {
                                if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                  pvVar11 = malloc(0x10);
                                }
                                else {
                                  pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                                }
                                *(void **)(puVar23 + 2) = pvVar11;
                                *puVar23 = 0x10;
                              }
                              else {
                                sVar15 = (ulong)uVar18 * 2;
                                if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                  pvVar11 = malloc(sVar15);
                                }
                                else {
                                  pvVar11 = realloc(*(void **)(puVar23 + 2),sVar15);
                                }
                                *(void **)(puVar23 + 2) = pvVar11;
                                *puVar23 = (uint)sVar15;
                              }
                            }
                            else {
                              pvVar11 = *(void **)(puVar23 + 2);
                            }
                            uVar18 = puVar23[1];
                            puVar23[1] = uVar18 + 1;
                            *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                            lVar22 = lVar22 + 1;
                          } while (lVar22 != 3);
                        }
                        uVar16 = uVar16 + 1;
                      } while (uVar16 != uVar7);
                    }
                  }
                  else if (0 < (int)uVar7) {
                    uVar16 = 0;
                    do {
                      if ((pcVar17[uVar16] & 0xfeU) == 0x30) {
                        puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                        sVar15 = strlen(pcVar10);
                        if (0 < (int)(uint)sVar15) {
                          uVar21 = 0;
                          do {
                            cVar1 = pcVar10[uVar21];
                            uVar18 = puVar23[1];
                            if (uVar18 == *puVar23) {
                              if ((int)uVar18 < 0x10) {
                                if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                  pvVar11 = malloc(0x10);
                                }
                                else {
                                  pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                                }
                                *(void **)(puVar23 + 2) = pvVar11;
                                *puVar23 = 0x10;
                              }
                              else {
                                sVar3 = (ulong)uVar18 * 2;
                                if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                  pvVar11 = malloc(sVar3);
                                }
                                else {
                                  pvVar11 = realloc(*(void **)(puVar23 + 2),sVar3);
                                }
                                *(void **)(puVar23 + 2) = pvVar11;
                                *puVar23 = (uint)sVar3;
                              }
                            }
                            else {
                              pvVar11 = *(void **)(puVar23 + 2);
                            }
                            uVar18 = puVar23[1];
                            puVar23[1] = uVar18 + 1;
                            *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                            uVar21 = uVar21 + 1;
                          } while (((uint)sVar15 & 0x7fffffff) != uVar21);
                          puVar23 = *(uint **)((long)local_108 + uVar16 * 8);
                        }
                        lVar22 = 0;
                        do {
                          cVar1 = ".names n%0*d\n 1\n"[lVar22 + 0xd];
                          uVar18 = puVar23[1];
                          if (uVar18 == *puVar23) {
                            if ((int)uVar18 < 0x10) {
                              if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                pvVar11 = malloc(0x10);
                              }
                              else {
                                pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
                              }
                              *(void **)(puVar23 + 2) = pvVar11;
                              *puVar23 = 0x10;
                            }
                            else {
                              sVar15 = (ulong)uVar18 * 2;
                              if (*(void **)(puVar23 + 2) == (void *)0x0) {
                                pvVar11 = malloc(sVar15);
                              }
                              else {
                                pvVar11 = realloc(*(void **)(puVar23 + 2),sVar15);
                              }
                              *(void **)(puVar23 + 2) = pvVar11;
                              *puVar23 = (uint)sVar15;
                            }
                          }
                          else {
                            pvVar11 = *(void **)(puVar23 + 2);
                          }
                          uVar18 = puVar23[1];
                          puVar23[1] = uVar18 + 1;
                          *(char *)((long)pvVar11 + (long)(int)uVar18) = cVar1;
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 3);
                      }
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != uVar7);
                  }
                  local_b8 = (ulong)((int)local_b8 + 1);
                  goto LAB_002d55db;
                }
                pcVar10 = Extra_FileReaderGetFileName(p);
                sVar15 = strlen(pcVar17);
                printf("%s (line %d): Output cube length (%d) differs from the number of outputs (%d).\n"
                       ,pcVar10,iVar4,sVar15 & 0xffffffff,(ulong)uVar7);
              }
              else {
                pcVar10 = Extra_FileReaderGetFileName(p);
                printf("%s (line %d): Input and output cubes are not specified.\n",pcVar10,iVar4);
              }
            }
            goto LAB_002d58d0;
          }
          if (iVar5 - 1U != uVar7) {
            printf(
                  "Warning: Mismatch between the number of POs on the .o line (%d) and the number of POs on the .ob line (%d).\n"
                  );
            iVar5 = *(int *)((long)pvVar11 + 4);
          }
          if (1 < iVar5) {
            lVar22 = 1;
            do {
              Io_ReadCreatePo(pNtk,*(char **)(*(long *)((long)pvVar11 + 8) + lVar22 * 8));
              lVar22 = lVar22 + 1;
            } while (lVar22 < *(int *)((long)pvVar11 + 4));
          }
        }
      }
LAB_002d55db:
      pvVar11 = Extra_FileReaderGetTokens(p);
    } while (pvVar11 != (void *)0x0);
  }
LAB_002d5612:
  Extra_ProgressBarStop(p_00);
  if ((uint)local_b8 != uVar9 && uVar9 != 0xffffffff) {
    printf("Warning: Mismatch between the number of cubes (%d) and the number on .p line (%d).\n",
           local_b8,(ulong)uVar9);
  }
  pVVar14 = pNtk->vPos;
  if (pVVar14->nSize < 1) {
    if (local_108 == (void *)0x0) goto LAB_002d578c;
  }
  else {
    lVar22 = 0;
    do {
      pAVar19 = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar14->pArray[lVar22] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar14->pArray[lVar22] + 0x20) * 8);
      if (pAVar19->pNtk->ntkType == ABC_NTK_NETLIST) {
        pAVar19 = (Abc_Obj_t *)pAVar19->pNtk->vObjs->pArray[*(pAVar19->vFanins).pArray];
      }
      puVar23 = *(uint **)((long)local_108 + lVar22 * 8);
      uVar9 = puVar23[1];
      if ((ulong)uVar9 == 0) {
        Abc_ObjRemoveFanins(pAVar19);
        pMan = (Mem_Flex_t *)pNtk->pManFunc;
        pcVar10 = " 0\n";
      }
      else {
        if (uVar9 == *puVar23) {
          if ((int)uVar9 < 0x10) {
            if (*(void **)(puVar23 + 2) == (void *)0x0) {
              pvVar11 = malloc(0x10);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar23 + 2),0x10);
            }
            *(void **)(puVar23 + 2) = pvVar11;
            *puVar23 = 0x10;
          }
          else {
            sVar15 = (ulong)uVar9 * 2;
            if (*(void **)(puVar23 + 2) == (void *)0x0) {
              pvVar11 = malloc(sVar15);
            }
            else {
              pvVar11 = realloc(*(void **)(puVar23 + 2),sVar15);
            }
            *(void **)(puVar23 + 2) = pvVar11;
            *puVar23 = (uint)sVar15;
          }
        }
        else {
          pvVar11 = *(void **)(puVar23 + 2);
        }
        uVar9 = puVar23[1];
        puVar23[1] = uVar9 + 1;
        *(undefined1 *)((long)pvVar11 + (long)(int)uVar9) = 0;
        Io_ReadPlaCubePreprocess(*(Vec_Str_t **)((long)local_108 + lVar22 * 8),(int)lVar22,0);
        pMan = (Mem_Flex_t *)pNtk->pManFunc;
        pcVar10 = *(char **)(*(long *)((long)local_108 + lVar22 * 8) + 8);
      }
      pcVar10 = Abc_SopRegister(pMan,pcVar10);
      (pAVar19->field_5).pData = pcVar10;
      pvVar11 = *(void **)((long)local_108 + lVar22 * 8);
      pvVar13 = *(void **)((long)pvVar11 + 8);
      if (pvVar13 != (void *)0x0) {
        free(pvVar13);
      }
      free(pvVar11);
      lVar22 = lVar22 + 1;
      pVVar14 = pNtk->vPos;
    } while (lVar22 < pVVar14->nSize);
  }
  free(local_108);
LAB_002d578c:
  Abc_NtkFinalizeRead(pNtk);
  Extra_FileReaderFree(p);
  if (fCheck == 0) {
    return pNtk;
  }
  iVar4 = Abc_NtkCheckRead(pNtk);
  if (iVar4 == 0) {
    puts("Io_ReadPla: The network check has failed.");
    Abc_NtkDelete(pNtk);
    return (Abc_Ntk_t *)0x0;
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Io_ReadPla( char * pFileName, int fZeros, int fBoth, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t|" );
//    p = Extra_FileReaderAlloc( pFileName, "", "\n\r", " \t|" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadPlaNetwork( p, fZeros, fBoth );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadPla: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}